

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O1

void __thiscall
Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>>>::
loadFromIterator<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>>>::RefIterator>
          (Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>>> *this,
          RefIterator it)

{
  IntegerConstantType *this_00;
  Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *pMVar1;
  __mpz_struct local_60;
  __mpz_struct local_50;
  uint local_40;
  MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_> *local_38;
  
  for (pMVar1 = it._pointer; pMVar1 != (it._stack)->_stack; pMVar1 = pMVar1 + -1) {
    Kernel::IntegerConstantType::IntegerConstantType
              ((IntegerConstantType *)&local_60,(IntegerConstantType *)(pMVar1 + -1));
    Kernel::IntegerConstantType::IntegerConstantType
              ((IntegerConstantType *)&local_50,&pMVar1[-1].numeral._den);
    local_40 = pMVar1[-1].factors._id;
    local_38 = pMVar1[-1].factors._ptr;
    if (*(long *)(this + 0x10) == *(long *)(this + 0x18)) {
      Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::expand
                ((Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_> *)this);
    }
    this_00 = *(IntegerConstantType **)(this + 0x10);
    Kernel::IntegerConstantType::IntegerConstantType(this_00,(IntegerConstantType *)&local_60);
    Kernel::IntegerConstantType::IntegerConstantType(this_00 + 1,(IntegerConstantType *)&local_50);
    this_00[2]._val[0]._mp_alloc = local_40;
    this_00[2]._val[0]._mp_d = (mp_limb_t *)local_38;
    *(long *)(this + 0x10) = *(long *)(this + 0x10) + 0x30;
    mpz_clear(&local_50);
    mpz_clear(&local_60);
  }
  return;
}

Assistant:

void loadFromIterator(It it) {
    // TODO check iterator.size() or iterator.sizeHint()
    while(it.hasNext()) {
      push(it.next());
    }
  }